

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.cpp
# Opt level: O0

void __thiscall MetaSim::DetVar::DetVar(DetVar *this,string *filename)

{
  byte bVar1;
  byte bVar2;
  undefined8 uVar3;
  string *in_RSI;
  undefined8 *in_RDI;
  string errMsg;
  double v;
  ifstream inFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  allocator local_2d1;
  string local_2d0 [32];
  string *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  Exc *in_stack_fffffffffffffd60;
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  double local_230 [3];
  undefined1 local_218 [520];
  string *local_10;
  
  local_10 = in_RSI;
  RandomVar::RandomVar((RandomVar *)0x148d69);
  *in_RDI = &PTR_clone_001659b8;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x148d98);
  std::ifstream::ifstream(local_218);
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::open(local_218,uVar3,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
      std::istream::operator>>(local_218,local_230);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffd10),
                 (value_type_conflict *)in_stack_fffffffffffffd08);
    }
    std::ifstream::close();
    *(undefined4 *)(in_RDI + 5) = 0;
    std::ifstream::~ifstream(local_218);
    return;
  }
  std::__cxx11::string::string(local_290,local_10);
  std::operator+((char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  std::operator+(in_stack_fffffffffffffd08,(char *)in_stack_fffffffffffffd00);
  std::__cxx11::string::~string(local_270);
  std::__cxx11::string::~string(local_290);
  uVar3 = __cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffd50,local_250);
  paVar4 = &local_2d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"DetVar",paVar4);
  RandomVar::Exc::Exc(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50)
  ;
  __cxa_throw(uVar3,&RandomVar::Exc::typeinfo,RandomVar::Exc::~Exc);
}

Assistant:

DetVar::DetVar(const std::string &filename) :
        _array()
    {
        DBGENTER(_RANDOMVAR_DBG_LEV);
        ifstream inFile;
        double v;

        DBGPRINT_2("Reading from ", filename);

        inFile.open(filename.c_str());
        if (!inFile.is_open()) {
            string errMsg = Exc::_FILEOPEN  + string(filename) + "\n";
            throw Exc(errMsg, "DetVar");
        }
        while (!inFile.eof()) {
            inFile >> v;
            _array.push_back(v);
            DBGVAR(_array.back());
        }
        inFile.close();
        _count = 0;
    }